

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::GetDefaultBlindingKeyRequest::ConvertFromStruct
          (GetDefaultBlindingKeyRequest *this,GetDefaultBlindingKeyRequestStruct *data)

{
  GetDefaultBlindingKeyRequestStruct *data_local;
  GetDefaultBlindingKeyRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->master_blinding_key_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->locking_script_,(string *)&data->locking_script);
  std::__cxx11::string::operator=((string *)&this->address_,(string *)&data->address);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void GetDefaultBlindingKeyRequest::ConvertFromStruct(
    const GetDefaultBlindingKeyRequestStruct& data) {
  master_blinding_key_ = data.master_blinding_key;
  locking_script_ = data.locking_script;
  address_ = data.address;
  ignore_items = data.ignore_items;
}